

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

size_t __thiscall
pbrt::
HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::FindOffset(HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
             *this,int *key)

{
  anon_struct_4_0_00000001_for___align aVar1;
  optional<std::pair<int,_int>_> *poVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  aVar1 = (anon_struct_4_0_00000001_for___align)*key;
  poVar2 = (this->table).ptr;
  uVar4 = (this->table).nStored - 1;
  uVar5 = uVar4 & (long)(int)aVar1;
  if ((poVar2[uVar5].set == true) && (aVar1 != poVar2[uVar5].optionalValue.__align)) {
    uVar6 = 1;
    do {
      uVar3 = (ulong)(uVar6 * uVar6 >> 1) + (uVar6 >> 1) + uVar5 & uVar4;
      if (poVar2[uVar3].set != true) {
        return uVar3;
      }
      uVar6 = uVar6 + 1;
    } while (aVar1 != poVar2[uVar3].optionalValue.__align);
    return uVar3;
  }
  return uVar5;
}

Assistant:

PBRT_CPU_GPU
    size_t FindOffset(const Key &key) const {
        size_t baseOffset = Hash()(key) & (capacity() - 1);
        for (int nProbes = 0;; ++nProbes) {
            // Find offset for _key_ using quadratic probing
            size_t offset =
                (baseOffset + nProbes / 2 + nProbes * nProbes / 2) & (capacity() - 1);
            if (table[offset].has_value() == false || key == table[offset]->first)
                return offset;
        }
    }